

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_7::Validator::CheckVar
          (Validator *this,Index max_index,Var *var,char *desc,Index *out_index)

{
  char *pcVar1;
  int __c;
  undefined4 in_register_00000034;
  char *__s;
  Enum EVar2;
  
  __s = (char *)CONCAT44(in_register_00000034,max_index);
  pcVar1 = Var::index(var,__s,(int)var);
  if ((uint)pcVar1 < max_index) {
    EVar2 = Ok;
    if (out_index != (Index *)0x0) {
      pcVar1 = Var::index(var,__s,__c);
      *out_index = (Index)pcVar1;
    }
  }
  else {
    PrintError(this,&var->loc,"%s variable out of range (max %u)",desc,(ulong)max_index);
    EVar2 = Error;
  }
  return (Result)EVar2;
}

Assistant:

Result Validator::CheckVar(Index max_index,
                           const Var* var,
                           const char* desc,
                           Index* out_index) {
  if (var->index() < max_index) {
    if (out_index) {
      *out_index = var->index();
    }
    return Result::Ok;
  }
  PrintError(&var->loc, "%s variable out of range (max %" PRIindex ")", desc,
             max_index);
  return Result::Error;
}